

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.cpp
# Opt level: O2

void __thiscall
Outputs::Display::OpenGL::Rectangle::Rectangle
          (Rectangle *this,float x,float y,float width,float height)

{
  uint __line;
  int iVar1;
  GLint GVar2;
  ostream *poVar3;
  socklen_t __len;
  vector<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  *attribute_bindings;
  sockaddr *__addr;
  string *vertex_shader;
  char *pcVar4;
  allocator<char> local_9a;
  allocator<char> local_99;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float buffer [8];
  string local_68;
  vector<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  local_48;
  
  local_98 = x;
  local_94 = y;
  local_90 = width;
  local_8c = height;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buffer,
             "#version 150\nin vec2 position;void main(void){gl_Position = vec4(position, 0.0, 1.0);}"
             ,&local_99);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "#version 150\nuniform vec4 colour;out vec4 fragColour;void main(void){fragColour = colour;}"
             ,&local_9a);
  attribute_bindings = &local_48;
  local_48.
  super__Vector_base<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertex_shader = (string *)buffer;
  Shader::Shader(&this->pixel_shader_,vertex_shader,&local_68,attribute_bindings);
  __len = (socklen_t)attribute_bindings;
  iVar1 = (int)vertex_shader;
  std::
  vector<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  ::~vector(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)buffer);
  this->drawing_vertex_array_ = 0;
  this->drawing_array_buffer_ = 0;
  Shader::bind(&this->pixel_shader_,iVar1,__addr,__len);
  glGenVertexArrays(1,&this->drawing_vertex_array_);
  iVar1 = glGetError();
  if (iVar1 == 0) {
    glGenBuffers(1,&this->drawing_array_buffer_);
    iVar1 = glGetError();
    if (iVar1 == 0) {
      glBindVertexArray(this->drawing_vertex_array_);
      iVar1 = glGetError();
      if (iVar1 == 0) {
        glBindBuffer(0x8892,this->drawing_array_buffer_);
        iVar1 = glGetError();
        if (iVar1 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)buffer,"position",(allocator<char> *)&local_68);
          GVar2 = Shader::get_attrib_location(&this->pixel_shader_,(string *)buffer);
          std::__cxx11::string::~string((string *)buffer);
          glEnableVertexAttribArray(GVar2);
          iVar1 = glGetError();
          if (iVar1 == 0) {
            glVertexAttribPointer(GVar2,2,0x1406,0,8,0);
            iVar1 = glGetError();
            if (iVar1 == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)buffer,"colour",(allocator<char> *)&local_68);
              GVar2 = Shader::get_uniform_location(&this->pixel_shader_,(string *)buffer);
              this->colour_uniform_ = GVar2;
              std::__cxx11::string::~string((string *)buffer);
              buffer[0] = local_98;
              buffer[1] = local_94;
              buffer[2] = local_98;
              buffer[3] = local_8c + local_94;
              buffer[4] = local_90 + local_98;
              buffer[5] = local_94;
              buffer[6] = buffer[4];
              buffer[7] = buffer[3];
              glBindBuffer(0x8892,this->drawing_array_buffer_);
              iVar1 = glGetError();
              if (iVar1 != 0) {
                switch(iVar1) {
                case 0x500:
                  pcVar4 = "GL_INVALID_ENUM";
                  break;
                case 0x501:
                  pcVar4 = "GL_INVALID_VALUE";
                  break;
                case 0x502:
                  pcVar4 = "GL_INVALID_OPERATION";
                  break;
                default:
                  poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
                  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
                  goto LAB_0037686d;
                case 0x505:
                  pcVar4 = "GL_OUT_OF_MEMORY";
                  break;
                case 0x506:
                  pcVar4 = "GL_INVALID_FRAMEBUFFER_OPERATION";
                }
                std::operator<<((ostream *)&std::cerr,pcVar4);
LAB_0037686d:
                poVar3 = std::operator<<((ostream *)&std::cerr," at line ");
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x40);
                poVar3 = std::operator<<(poVar3," in ");
                poVar3 = std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                                        );
                std::endl<char,std::char_traits<char>>(poVar3);
                __line = 0x40;
                goto LAB_00376956;
              }
              glBufferData(0x8892,0x20,buffer,0x88e4);
              iVar1 = glGetError();
              if (iVar1 == 0) {
                return;
              }
              switch(iVar1) {
              case 0x500:
                pcVar4 = "GL_INVALID_ENUM";
                break;
              case 0x501:
                pcVar4 = "GL_INVALID_VALUE";
                break;
              case 0x502:
                pcVar4 = "GL_INVALID_OPERATION";
                break;
              default:
                poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
                std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
                goto LAB_003768fb;
              case 0x505:
                pcVar4 = "GL_OUT_OF_MEMORY";
                break;
              case 0x506:
                pcVar4 = "GL_INVALID_FRAMEBUFFER_OPERATION";
              }
              std::operator<<((ostream *)&std::cerr,pcVar4);
LAB_003768fb:
              poVar3 = std::operator<<((ostream *)&std::cerr," at line ");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x41);
              poVar3 = std::operator<<(poVar3," in ");
              poVar3 = std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                                      );
              std::endl<char,std::char_traits<char>>(poVar3);
              __line = 0x41;
              goto LAB_00376956;
            }
            switch(iVar1) {
            case 0x500:
              pcVar4 = "GL_INVALID_ENUM";
              break;
            case 0x501:
              pcVar4 = "GL_INVALID_VALUE";
              break;
            case 0x502:
              pcVar4 = "GL_INVALID_OPERATION";
              break;
            default:
              poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
              std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
              goto LAB_003767df;
            case 0x505:
              pcVar4 = "GL_OUT_OF_MEMORY";
              break;
            case 0x506:
              pcVar4 = "GL_INVALID_FRAMEBUFFER_OPERATION";
            }
            std::operator<<((ostream *)&std::cerr,pcVar4);
LAB_003767df:
            poVar3 = std::operator<<((ostream *)&std::cerr," at line ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x33);
            poVar3 = std::operator<<(poVar3," in ");
            poVar3 = std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                                    );
            std::endl<char,std::char_traits<char>>(poVar3);
            __line = 0x33;
            goto LAB_00376956;
          }
          switch(iVar1) {
          case 0x500:
            pcVar4 = "GL_INVALID_ENUM";
            break;
          case 0x501:
            pcVar4 = "GL_INVALID_VALUE";
            break;
          case 0x502:
            pcVar4 = "GL_INVALID_OPERATION";
            break;
          default:
            poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            goto LAB_00376751;
          case 0x505:
            pcVar4 = "GL_OUT_OF_MEMORY";
            break;
          case 0x506:
            pcVar4 = "GL_INVALID_FRAMEBUFFER_OPERATION";
          }
          std::operator<<((ostream *)&std::cerr,pcVar4);
LAB_00376751:
          poVar3 = std::operator<<((ostream *)&std::cerr," at line ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2b);
          poVar3 = std::operator<<(poVar3," in ");
          poVar3 = std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                                  );
          std::endl<char,std::char_traits<char>>(poVar3);
          __line = 0x2b;
          goto LAB_00376956;
        }
        switch(iVar1) {
        case 0x500:
          pcVar4 = "GL_INVALID_ENUM";
          break;
        case 0x501:
          pcVar4 = "GL_INVALID_VALUE";
          break;
        case 0x502:
          pcVar4 = "GL_INVALID_OPERATION";
          break;
        default:
          poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          goto LAB_003766c3;
        case 0x505:
          pcVar4 = "GL_OUT_OF_MEMORY";
          break;
        case 0x506:
          pcVar4 = "GL_INVALID_FRAMEBUFFER_OPERATION";
        }
        std::operator<<((ostream *)&std::cerr,pcVar4);
LAB_003766c3:
        poVar3 = std::operator<<((ostream *)&std::cerr," at line ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x28);
        poVar3 = std::operator<<(poVar3," in ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        __line = 0x28;
        goto LAB_00376956;
      }
      switch(iVar1) {
      case 0x500:
        pcVar4 = "GL_INVALID_ENUM";
        break;
      case 0x501:
        pcVar4 = "GL_INVALID_VALUE";
        break;
      case 0x502:
        pcVar4 = "GL_INVALID_OPERATION";
        break;
      default:
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        goto LAB_00376635;
      case 0x505:
        pcVar4 = "GL_OUT_OF_MEMORY";
        break;
      case 0x506:
        pcVar4 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      }
      std::operator<<((ostream *)&std::cerr,pcVar4);
LAB_00376635:
      poVar3 = std::operator<<((ostream *)&std::cerr," at line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x27);
      poVar3 = std::operator<<(poVar3," in ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      __line = 0x27;
      goto LAB_00376956;
    }
    switch(iVar1) {
    case 0x500:
      pcVar4 = "GL_INVALID_ENUM";
      break;
    case 0x501:
      pcVar4 = "GL_INVALID_VALUE";
      break;
    case 0x502:
      pcVar4 = "GL_INVALID_OPERATION";
      break;
    default:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      goto LAB_003765a7;
    case 0x505:
      pcVar4 = "GL_OUT_OF_MEMORY";
      break;
    case 0x506:
      pcVar4 = "GL_INVALID_FRAMEBUFFER_OPERATION";
    }
    std::operator<<((ostream *)&std::cerr,pcVar4);
LAB_003765a7:
    poVar3 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x25);
    poVar3 = std::operator<<(poVar3," in ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    __line = 0x25;
    goto LAB_00376956;
  }
  switch(iVar1) {
  case 0x500:
    pcVar4 = "GL_INVALID_ENUM";
    break;
  case 0x501:
    pcVar4 = "GL_INVALID_VALUE";
    break;
  case 0x502:
    pcVar4 = "GL_INVALID_OPERATION";
    break;
  default:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    goto LAB_00376519;
  case 0x505:
    pcVar4 = "GL_OUT_OF_MEMORY";
    break;
  case 0x506:
    pcVar4 = "GL_INVALID_FRAMEBUFFER_OPERATION";
  }
  std::operator<<((ostream *)&std::cerr,pcVar4);
LAB_00376519:
  poVar3 = std::operator<<((ostream *)&std::cerr," at line ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x24);
  poVar3 = std::operator<<(poVar3," in ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  __line = 0x24;
LAB_00376956:
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                ,__line,"Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)"
               );
}

Assistant:

Rectangle::Rectangle(float x, float y, float width, float height):
	pixel_shader_(
		"#version 150\n"

		"in vec2 position;"

		"void main(void)"
		"{"
			"gl_Position = vec4(position, 0.0, 1.0);"
		"}",

		"#version 150\n"

		"uniform vec4 colour;"
		"out vec4 fragColour;"

		"void main(void)"
		"{"
			"fragColour = colour;"
		"}"
	){
	pixel_shader_.bind();

	test_gl(glGenVertexArrays, 1, &drawing_vertex_array_);
	test_gl(glGenBuffers, 1, &drawing_array_buffer_);

	test_gl(glBindVertexArray, drawing_vertex_array_);
	test_gl(glBindBuffer, GL_ARRAY_BUFFER, drawing_array_buffer_);

	GLint position_attribute = pixel_shader_.get_attrib_location("position");
	test_gl(glEnableVertexAttribArray, GLuint(position_attribute));

	test_gl(glVertexAttribPointer,
		(GLuint)position_attribute,
		2,
		GL_FLOAT,
		GL_FALSE,
		2 * sizeof(GLfloat),
		(void *)0);

	colour_uniform_ = pixel_shader_.get_uniform_location("colour");

	float buffer[4*2];

	// Store positions.
	buffer[0] = x;			buffer[1] = y;
	buffer[2] = x;			buffer[3] = y + height;
	buffer[4] = x + width;	buffer[5] = y;
	buffer[6] = x + width;	buffer[7] = y + height;

	// Upload buffer.
	test_gl(glBindBuffer, GL_ARRAY_BUFFER, drawing_array_buffer_);
	test_gl(glBufferData, GL_ARRAY_BUFFER, sizeof(buffer), buffer, GL_STATIC_DRAW);
}